

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::embeddings_gradient
               (tensor *prev,tensor *gradient_input,tensor *grads,tensor *freqs,float learning_rate,
               bool scale)

{
  longlong lVar1;
  longlong lVar2;
  ostream *poVar3;
  string *a;
  undefined8 uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *in_RCX;
  tensor *in_RDX;
  tensor *in_RSI;
  tensor *in_RDI;
  byte in_R8B;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> embedding_mutexes;
  long nc;
  long nr;
  long nk;
  long ns;
  float *grads_data;
  float *freqs_data;
  float *gradient_input_data;
  float *prev_data;
  ostringstream dlib_o_out;
  anon_class_104_13_45b05625 *funct;
  long in_stack_fffffffffffffbc8;
  allocator_type *in_stack_fffffffffffffbd0;
  size_type in_stack_fffffffffffffbd8;
  error_type t;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> *in_stack_fffffffffffffbe0;
  anon_class_104_13_45b05625 local_231;
  ostringstream local_1a0 [379];
  byte local_25;
  long *local_20;
  tensor *local_18;
  tensor *local_10;
  tensor *local_8;
  
  local_25 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar1 = tensor::nr(in_RDI);
  if (0 < lVar1) {
    lVar1 = tensor::num_samples(local_10);
    lVar2 = tensor::num_samples(local_8);
    if (lVar1 == lVar2) {
      lVar1 = tensor::k(local_10);
      lVar2 = tensor::k(local_8);
      if (lVar1 == lVar2) {
        lVar1 = tensor::nr(local_10);
        lVar2 = tensor::nr(local_8);
        if (lVar1 == lVar2) {
          lVar1 = tensor::nc(local_10);
          lVar2 = tensor::k(local_18);
          if (lVar1 == lVar2) {
            lVar1 = tensor::num_samples(local_18);
            if (0 < lVar1) {
              lVar1 = tensor::k(local_18);
              if (0 < lVar1) {
                lVar1 = tensor::nr(local_18);
                if (lVar1 == 1) {
                  lVar1 = tensor::nc(local_18);
                  if (lVar1 == 1) {
                    local_231.gradient_input._1_4_ = (*local_8->_vptr_tensor[2])();
                    local_231._85_4_ = extraout_var;
                    local_231.gradient_input_data._1_4_ = (*local_10->_vptr_tensor[2])();
                    local_231._77_4_ = extraout_var_00;
                    local_231._65_8_ = (**(code **)(*local_20 + 0x10))();
                    local_231.embedding_mutexes._1_4_ = (*local_18->_vptr_tensor[3])();
                    local_231._61_4_ = extraout_var_01;
                    local_231._49_8_ = tensor::num_samples(local_10);
                    local_231._41_8_ = tensor::k(local_10);
                    local_231._33_8_ = tensor::nr(local_10);
                    local_231._25_8_ = tensor::nc(local_10);
                    lVar1 = tensor::num_samples(local_18);
                    funct = &local_231;
                    std::allocator<dlib::mutex>::allocator((allocator<dlib::mutex> *)0x24c9eb);
                    std::vector<dlib::mutex,_std::allocator<dlib::mutex>_>::vector
                              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                               in_stack_fffffffffffffbd0);
                    std::allocator<dlib::mutex>::~allocator((allocator<dlib::mutex> *)0x24ca10);
                    parallel_for<dlib::cpu::embeddings_gradient(dlib::tensor_const&,dlib::tensor_const&,dlib::tensor&,dlib::tensor_const&,float,bool)::__0>
                              ((long)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,funct,lVar1
                              );
                    std::vector<dlib::mutex,_std::allocator<dlib::mutex>_>::~vector
                              ((vector<dlib::mutex,_std::allocator<dlib::mutex>_> *)
                               in_stack_fffffffffffffbd0);
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"\n\nError detected at line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x9fd);
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)local_1a0,"Error detected in file ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar3,".\n");
  poVar3 = std::operator<<((ostream *)local_1a0,"Error detected in function ");
  poVar3 = std::operator<<(poVar3,
                           "void dlib::cpu::embeddings_gradient(const tensor &, const tensor &, tensor &, const tensor &, float, bool)"
                          );
  std::operator<<(poVar3,".\n\n");
  poVar3 = std::operator<<((ostream *)local_1a0,"Failing expression was ");
  poVar3 = std::operator<<(poVar3,
                           "prev.nr() > 0 && gradient_input.num_samples() == prev.num_samples() && gradient_input.k() == prev.k() && gradient_input.nr() == prev.nr() && gradient_input.nc() == grads.k() && grads.num_samples() > 0 && grads.k() > 0 && grads.nr() == 1 && grads.nc() == 1"
                          );
  std::operator<<(poVar3,".\n");
  poVar3 = (ostream *)std::ostream::operator<<(local_1a0,std::boolalpha);
  poVar3 = std::operator<<(poVar3,"\ngradient_input.num_samples(): ");
  lVar1 = tensor::num_samples(local_10);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\ngradient_input.k(): ");
  lVar1 = tensor::k(local_10);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\ngradient_input.nr(): ");
  lVar1 = tensor::nr(local_10);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\ngradient_input.nc(): ");
  lVar1 = tensor::nc(local_10);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\nprev.num_samples(): ");
  lVar1 = tensor::num_samples(local_8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\nprev.k(): ");
  lVar1 = tensor::k(local_8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\nprev.nr(): ");
  lVar1 = tensor::nr(local_8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\nprev.nc(): ");
  lVar1 = tensor::nc(local_8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\ngrads.num_samples(): ");
  lVar1 = tensor::num_samples(local_18);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\ngrads.k(): ");
  lVar1 = tensor::k(local_18);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\ngrads.nr(): ");
  lVar1 = tensor::nr(local_18);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,lVar1);
  poVar3 = std::operator<<(poVar3,"\ngrads.nc(): ");
  lVar1 = tensor::nc(local_18);
  a = (string *)std::ostream::operator<<(poVar3,lVar1);
  t = (error_type)((ulong)lVar1 >> 0x20);
  std::operator<<((ostream *)a,"\n");
  local_231.learning_rate._0_1_ = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar3,t,a);
  local_231.learning_rate._0_1_ = 0;
  __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void embeddings_gradient(
            const tensor& prev,
            const tensor& gradient_input,
            tensor& grads,
            const tensor& freqs,
            float learning_rate,
            bool scale
        )
        {
            DLIB_CASSERT(
                prev.nr() > 0 &&
                gradient_input.num_samples() == prev.num_samples() &&
                gradient_input.k() == prev.k() &&
                gradient_input.nr() == prev.nr() &&
                gradient_input.nc() == grads.k() &&
                grads.num_samples() > 0 &&
                grads.k() > 0 &&
                grads.nr() == 1 &&
                grads.nc() == 1,
                "\ngradient_input.num_samples(): " << gradient_input.num_samples() <<
                "\ngradient_input.k(): " << gradient_input.k() <<
                "\ngradient_input.nr(): " << gradient_input.nr() <<
                "\ngradient_input.nc(): " << gradient_input.nc() <<
                "\nprev.num_samples(): " << prev.num_samples() <<
                "\nprev.k(): " << prev.k() <<
                "\nprev.nr(): " << prev.nr() <<
                "\nprev.nc(): " << prev.nc() <<
                "\ngrads.num_samples(): " << grads.num_samples() <<
                "\ngrads.k(): " << grads.k() <<
                "\ngrads.nr(): " << grads.nr() <<
                "\ngrads.nc(): " << grads.nc()
            );

            const float* prev_data = prev.host();
            const float* gradient_input_data = gradient_input.host();
            const float* freqs_data = freqs.host();
            float* grads_data = grads.host();
            long ns = gradient_input.num_samples(), nk = gradient_input.k();
            long nr = gradient_input.nr(), nc = gradient_input.nc();

            std::vector<dlib::mutex> embedding_mutexes(grads.num_samples());
            parallel_for(0, ns * nk, [&](long i)
                {
                    long s = i / nk;
                    long k = i % nk;

                    for (long r = 0; r < nr; ++r)
                    {
                        const unsigned long token_idx = static_cast<unsigned long>(prev_data[tensor_index(prev, s, k, r, 0)]);
                        if (token_idx < grads.num_samples())
                        {
                            const float freg_token = freqs_data[token_idx];
                            float freq_scale = 1.0f;

                            if (scale && freg_token != 0.0f) freq_scale = std::min(0.15f, std::max(1.0f / freg_token, 1.0f));
                            auto_mutex locker(embedding_mutexes[token_idx]);
                            for (long c = 0; c < nc; ++c)
                            {
                                const float gradient = gradient_input_data[tensor_index(gradient_input, s, k, r, c)];
                                grads_data[tensor_index(grads, token_idx, c, 0, 0)] -= (gradient * learning_rate * freq_scale);
                            }
                        }
                    }
                });
        }